

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftgloadr.c
# Opt level: O0

FT_Error FT_GlyphLoader_CreateExtra(FT_GlyphLoader loader)

{
  FT_Vector *pFVar1;
  FT_Memory memory;
  FT_GlyphLoader pFStack_10;
  FT_Error error;
  FT_GlyphLoader loader_local;
  
  pFStack_10 = loader;
  pFVar1 = (FT_Vector *)
           ft_mem_realloc(loader->memory,0x10,0,(ulong)(loader->max_points << 1),(void *)0x0,
                          (FT_Error *)((long)&memory + 4));
  (pFStack_10->base).extra_points = pFVar1;
  if (memory._4_4_ == 0) {
    pFStack_10->use_extra = '\x01';
    (pFStack_10->base).extra_points2 = (pFStack_10->base).extra_points + pFStack_10->max_points;
    FT_GlyphLoader_Adjust_Points(pFStack_10);
  }
  return memory._4_4_;
}

Assistant:

FT_BASE_DEF( FT_Error )
  FT_GlyphLoader_CreateExtra( FT_GlyphLoader  loader )
  {
    FT_Error   error;
    FT_Memory  memory = loader->memory;


    if ( !FT_NEW_ARRAY( loader->base.extra_points, 2 * loader->max_points ) )
    {
      loader->use_extra          = 1;
      loader->base.extra_points2 = loader->base.extra_points +
                                   loader->max_points;

      FT_GlyphLoader_Adjust_Points( loader );
    }
    return error;
  }